

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

void restore_cache(void)

{
  int iVar1;
  int *piVar2;
  __ssize_t _Var3;
  ulong uVar4;
  size_t sz;
  char *line;
  char *endp;
  int ret;
  FILE *fp;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  FILE *local_8;
  
  local_20 = (char *)0x0;
  local_28 = 0;
  if (s.cachefile != (char *)0x0) {
    local_8 = fopen(s.cachefile,"r");
    if (local_8 == (FILE *)0x0) {
      piVar2 = __errno_location();
      if (*piVar2 == 2) {
        return;
      }
      err(1,"fopen %s, r",s.cachefile);
    }
    do {
      do {
        iVar1 = feof(local_8);
        if (iVar1 != 0) goto LAB_00102ccf;
        _Var3 = getline(&local_20,&local_28,local_8);
        local_c = (int)_Var3;
      } while ((local_c < 1) || (*local_20 == '#'));
      uVar4 = strtoul(local_20,&local_18,0);
      local_c = (int)uVar4;
    } while ((local_18 <= local_20) || ((local_c < 0 || (0xfe < local_c))));
    s.current_sa = (uint8_t)uVar4;
LAB_00102ccf:
    fclose(local_8);
    if (local_20 != (char *)0x0) {
      free(local_20);
    }
  }
  return;
}

Assistant:

static void restore_cache(void)
{
	FILE *fp;
	int ret;
	char *endp;
	char *line = 0;
	size_t sz = 0;

	if (!s.cachefile)
		return;
	fp = fopen(s.cachefile, "r");
	if (!fp) {
		if (ENOENT == errno)
			return;
		err(1, "fopen %s, r", s.cachefile);
	}
	while (!feof(fp)) {
		ret = getline(&line, &sz, fp);
		if (ret <= 0)
			continue;
		if (line[0] == '#')
			continue;
		ret = strtoul(line, &endp, 0);
		if ((endp > line) && (ret >= 0) && (ret <= J1939_IDLE_ADDR)) {
			s.current_sa = ret;
			break;
		}
	}
	fclose(fp);
	if (line)
		free(line);
}